

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O2

void amrex::Finalize(AMReX *pamrex)

{
  ostringstream *poVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  int mp_tot;
  int global_min;
  int global_max;
  int mp_max;
  int mp_min;
  Print local_198;
  
  AMReX::erase(pamrex);
  while (::(anonymous_namespace)::The_Finalize_Function_Stack._48_8_ !=
         ::(anonymous_namespace)::The_Finalize_Function_Stack._16_8_) {
    lVar3 = ::(anonymous_namespace)::The_Finalize_Function_Stack._48_8_;
    if (::(anonymous_namespace)::The_Finalize_Function_Stack._48_8_ ==
        ::(anonymous_namespace)::The_Finalize_Function_Stack._56_8_) {
      lVar3 = *(long *)(::(anonymous_namespace)::The_Finalize_Function_Stack._72_8_ + -8) + 0x200;
    }
    (**(code **)(lVar3 + -8))();
    std::deque<void_(*)(),_std::allocator<void_(*)()>_>::pop_back
              ((deque<void_(*)(),_std::allocator<void_(*)()>_> *)
               ::(anonymous_namespace)::The_Finalize_Function_Stack);
  }
  if (1 < system::verbose) {
    amrex_mempool_get_stats(&mp_min,&mp_max,&mp_tot);
    if (*(int *)(ParallelContext::frames + 0x10) == 1) {
      if (mp_tot < 1) goto LAB_004d45d7;
      Print::Print(&local_198,(ostream *)system::osout);
      poVar1 = &local_198.ss;
      std::operator<<((ostream *)poVar1,"MemPool: ");
      std::operator<<((ostream *)poVar1,"tot used: ");
      std::ostream::operator<<(poVar1,mp_tot);
      std::operator<<((ostream *)poVar1," MB.");
      std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    }
    else {
      global_max = mp_tot;
      global_min = mp_tot;
      ParallelDescriptor::ReduceIntMax(&global_max);
      if (global_max < 1) goto LAB_004d45d7;
      ParallelDescriptor::ReduceIntMin(&global_min);
      Print::Print(&local_198,(ostream *)system::osout);
      poVar1 = &local_198.ss;
      std::operator<<((ostream *)poVar1,"MemPool: ");
      std::operator<<((ostream *)poVar1,"min used in a rank: ");
      std::ostream::operator<<(poVar1,global_min);
      std::operator<<((ostream *)poVar1," MB, ");
      std::operator<<((ostream *)poVar1,"max used in a rank: ");
      std::ostream::operator<<(poVar1,global_max);
      std::operator<<((ostream *)poVar1," MB.\n");
    }
    Print::~Print(&local_198);
  }
LAB_004d45d7:
  amrex_mempool_finalize();
  Arena::Finalize();
  if (system::signal_handling != 0) {
    if (::(anonymous_namespace)::prev_handler_sigsegv != (__sighandler_t)0xffffffffffffffff) {
      signal(0xb,::(anonymous_namespace)::prev_handler_sigsegv);
    }
    if (::(anonymous_namespace)::prev_handler_sigterm != (__sighandler_t)0xffffffffffffffff) {
      signal(0xf,::(anonymous_namespace)::prev_handler_sigterm);
    }
    if (::(anonymous_namespace)::prev_handler_sigint != (__sighandler_t)0xffffffffffffffff) {
      signal(2,::(anonymous_namespace)::prev_handler_sigint);
    }
    if (::(anonymous_namespace)::prev_handler_sigabrt != (__sighandler_t)0xffffffffffffffff) {
      signal(6,::(anonymous_namespace)::prev_handler_sigabrt);
    }
    if (::(anonymous_namespace)::prev_handler_sigfpe != (__sighandler_t)0xffffffffffffffff) {
      signal(8,::(anonymous_namespace)::prev_handler_sigfpe);
    }
    if (::(anonymous_namespace)::curr_fpe_excepts != 0) {
      fedisableexcept(::(anonymous_namespace)::curr_fpe_excepts);
      feenableexcept(::(anonymous_namespace)::prev_fpe_excepts);
    }
  }
  std::set_new_handler(::(anonymous_namespace)::prev_new_handler);
  *(undefined8 *)(system::osout + *(long *)(*(long *)system::osout + -0x18) + 8) =
       ::(anonymous_namespace)::prev_out_precision;
  *(undefined8 *)(system::oserr + *(long *)(*(long *)system::oserr + -0x18) + 8) =
       ::(anonymous_namespace)::prev_err_precision;
  iVar2 = *(int *)(ParallelContext::frames + 0xc);
  ParallelDescriptor::EndParallel();
  if ((iVar2 == 0) && (0 < system::verbose)) {
    poVar4 = std::operator<<((ostream *)system::osout,"AMReX (");
    Version_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,(string *)&local_198);
    poVar4 = std::operator<<(poVar4,") finalized");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_198);
  }
  return;
}

Assistant:

void
amrex::Finalize (amrex::AMReX* pamrex)
{
#ifdef AMREX_USE_GPU
    Gpu::streamSynchronizeAll();
#endif

    AMReX::erase(pamrex);

#ifdef AMREX_USE_HYPRE
    if (init_hypre) HYPRE_Finalize();
#endif

    BL_TINY_PROFILE_FINALIZE();
    BL_PROFILE_FINALIZE();

#ifdef AMREX_USE_CUDA
    amrex::DeallocateRandomSeedDevArray();
#endif

#ifdef BL_LAZY
    Lazy::Finalize();
#endif

    while (!The_Finalize_Function_Stack.empty())
    {
        //
        // Call the registered function.
        //
        (*The_Finalize_Function_Stack.top())();
        //
        // And then remove it from the stack.
        //
        The_Finalize_Function_Stack.pop();
    }

    // The MemPool stuff is not using The_Finalize_Function_Stack so that
    // it can be used in Fortran BoxLib.
#ifndef BL_AMRPROF
    if (amrex::system::verbose > 1)
    {
        int mp_min, mp_max, mp_tot;
        amrex_mempool_get_stats(mp_min, mp_max, mp_tot);  // in MB
        if (ParallelDescriptor::NProcs() == 1) {
            if (mp_tot > 0) {
                amrex::Print() << "MemPool: "
#ifdef AMREX_USE_OMP
                               << "min used in a thread: " << mp_min << " MB, "
                               << "max used in a thread: " << mp_max << " MB, "
#endif
                               << "tot used: " << mp_tot << " MB." << std::endl;
            }
        } else {
            int global_max = mp_tot;
            int global_min = mp_tot;
            ParallelDescriptor::ReduceIntMax(global_max);
            if (global_max > 0) {
                ParallelDescriptor::ReduceIntMin(global_min);
                amrex::Print() << "MemPool: "
                               << "min used in a rank: " << global_min << " MB, "
                               << "max used in a rank: " << global_max << " MB.\n";
            }
        }
    }
#endif

#ifdef AMREX_MEM_PROFILING
    MemProfiler::report("Final");
    MemProfiler::Finalize();
#endif

#ifdef AMREX_USE_SUNDIALS
    sundials::Finalize();
#endif

    amrex_mempool_finalize();
    Arena::Finalize();

#ifndef BL_AMRPROF
    if (system::signal_handling)
    {
        if (prev_handler_sigsegv != SIG_ERR) signal(SIGSEGV, prev_handler_sigsegv);
        if (prev_handler_sigterm != SIG_ERR) signal(SIGTERM, prev_handler_sigterm);
        if (prev_handler_sigint != SIG_ERR) signal(SIGINT, prev_handler_sigint);
        if (prev_handler_sigabrt != SIG_ERR) signal(SIGABRT, prev_handler_sigabrt);
        if (prev_handler_sigfpe != SIG_ERR) signal(SIGFPE, prev_handler_sigfpe);
#if defined(__linux__)
#if !defined(__PGI) || (__PGIC__ >= 16)
        if (curr_fpe_excepts != 0) {
            fedisableexcept(curr_fpe_excepts);
            feenableexcept(prev_fpe_excepts);
        }
#endif
#elif defined(__APPLE__) && defined(__x86_64__)
        if (curr_fpe_excepts != 0u) {
            _MM_SET_EXCEPTION_MASK(prev_fpe_mask);
        }
#endif
    }
#endif

#ifdef AMREX_USE_GPU
    Gpu::Device::Finalize();
#endif

#if defined(AMREX_USE_UPCXX)
    upcxx::finalize();
#endif

    std::set_new_handler(prev_new_handler);

    amrex::OutStream().precision(prev_out_precision);
    amrex::ErrorStream().precision(prev_err_precision);

    bool is_ioproc = ParallelDescriptor::IOProcessor();

    /* Don't shut down MPI if GASNet is still using MPI */
#ifndef GASNET_CONDUIT_MPI
    ParallelDescriptor::EndParallel();
#endif

    if (amrex::system::verbose > 0 && is_ioproc) {
        amrex::OutStream() << "AMReX (" << amrex::Version() << ") finalized" << std::endl;
    }
}